

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void google::protobuf::internal::PackedFieldHelper<7>::
     Serialize<google::protobuf::internal::ArrayOutput>
               (void *field,FieldMetadata *md,ArrayOutput *output)

{
  uint *puVar1;
  uint *puVar2;
  RepeatedField<unsigned_int> *array;
  int i;
  int index;
  
  if (*field != 0) {
    WriteTagTo<google::protobuf::internal::ArrayOutput>(md->tag,output);
    WriteLengthTo<google::protobuf::internal::ArrayOutput>(*(uint32 *)((long)field + 0x10),output);
    for (index = 0; index < *field; index = index + 1) {
      puVar2 = RepeatedField<unsigned_int>::Get((RepeatedField<unsigned_int> *)field,index);
      puVar1 = (uint *)output->ptr;
      *puVar1 = *puVar2;
      output->ptr = (uint8 *)(puVar1 + 1);
    }
  }
  return;
}

Assistant:

inline bool RepeatedField<Element>::empty() const {
  return current_size_ == 0;
}